

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

utf8_char_t * utf8_load_text_file(char *path,size_t *size)

{
  size_t sVar1;
  FILE *__stream;
  size_t __n;
  utf8_char_t *__s;
  size_t sVar2;
  utf8_char_t *__ptr;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    __s = (utf8_char_t *)0x0;
  }
  else {
    __s = (utf8_char_t *)0x0;
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if (*size == 0 || __n <= *size) {
      *size = 0;
      __s = (utf8_char_t *)malloc(__n + 1);
      memset(__s,0,__n);
      if (__s != (utf8_char_t *)0x0) {
        sVar2 = fread(__s,1,__n - *size,__stream);
        __ptr = __s;
        for (; sVar2 != 0; sVar2 = fread(__ptr,1,__n - (sVar2 + sVar1),__stream)) {
          __ptr = __ptr + sVar2;
          sVar1 = *size;
          *size = sVar2 + sVar1;
        }
      }
      fclose(__stream);
    }
  }
  __s[*size] = '\0';
  return __s;
}

Assistant:

utf8_char_t* utf8_load_text_file(const char* path, size_t* size)
{
    utf8_char_t* data = NULL;
    FILE* file = fopen(path, "r");

    if (file) {
        fseek(file, 0, SEEK_END);
        size_t file_size = ftell(file);
        fseek(file, 0, SEEK_SET);

        if (0 == (*size) || file_size <= (*size)) {
            (*size) = 0;
            data = (utf8_char_t*)malloc(1 + file_size);
            memset(data, '\0', file_size);

            if (data) {
                utf8_char_t* pos = data;
                size_t bytes_read = 0;

                while (0 < (bytes_read = fread(pos, 1, file_size - (*size), file))) {
                    pos += bytes_read;
                    (*size) += bytes_read;
                }
            }

            fclose(file);
        }
    }

    data[*size] = 0;
    return data;
}